

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

file_status __thiscall boost::filesystem::detail::status(detail *this,path *p,error_code *ec)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  error_category *peVar4;
  uint *puVar5;
  filesystem_error *this_00;
  uint uVar6;
  error_code ec_00;
  stat path_stat;
  string local_d8;
  stat64 local_b8;
  
  iVar1 = stat64((p->m_pathname)._M_dataplus._M_p,&local_b8);
  if (iVar1 == 0) {
    if (ec != (error_code *)0x0) {
      ec->m_val = 0;
      peVar4 = system::system_category();
      ec->m_cat = peVar4;
    }
    uVar6 = 0xffff;
    uVar2 = 10;
    switch((local_b8.st_mode & 0xf000) - 0x1000 >> 0xc) {
    case 0:
      uVar2 = 7;
      break;
    case 1:
      uVar2 = 6;
      break;
    default:
      goto switchD_0010d702_caseD_2;
    case 3:
      uVar2 = 3;
      break;
    case 5:
      uVar2 = 5;
      break;
    case 7:
      uVar2 = 2;
      break;
    case 0xb:
      uVar2 = 8;
    }
    uVar6 = local_b8.st_mode & 0xfff;
  }
  else {
    if (ec != (error_code *)0x0) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      peVar4 = system::system_category();
      ec->m_val = iVar1;
      ec->m_cat = peVar4;
    }
    puVar5 = (uint *)__errno_location();
    uVar6 = 0;
    uVar2 = 1;
    if ((*puVar5 != 2) && (*puVar5 != 0x14)) {
      if (ec == (error_code *)0x0) {
        this_00 = (filesystem_error *)__cxa_allocate_exception(0x50);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"boost::filesystem::status","");
        uVar6 = *puVar5;
        peVar4 = system::system_category();
        ec_00._4_4_ = 0;
        ec_00.m_val = uVar6;
        ec_00.m_cat = peVar4;
        filesystem_error::filesystem_error(this_00,&local_d8,p,ec_00);
        __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      uVar6 = 0xffff;
      uVar2 = 0;
    }
  }
switchD_0010d702_caseD_2:
  *(undefined4 *)this = uVar2;
  *(uint *)(this + 4) = uVar6;
  return (file_status)this;
}

Assistant:

BOOST_FILESYSTEM_DECL
  file_status status(const path& p, error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (::stat(p.c_str(), &path_stat)!= 0)
    {
      if (ec != 0)                            // always report errno, even though some
        ec->assign(errno, system_category());   // errno values are not status_errors

      if (not_found_error(errno))
      {
        return fs::file_status(fs::file_not_found, fs::no_perms);
      }
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error("boost::filesystem::status",
          p, error_code(errno, system_category())));
      return fs::file_status(fs::status_error);
    }
    if (ec != 0) ec->clear();;
    if (S_ISDIR(path_stat.st_mode))
      return fs::file_status(fs::directory_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISREG(path_stat.st_mode))
      return fs::file_status(fs::regular_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISBLK(path_stat.st_mode))
      return fs::file_status(fs::block_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISCHR(path_stat.st_mode))
      return fs::file_status(fs::character_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISFIFO(path_stat.st_mode))
      return fs::file_status(fs::fifo_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    if (S_ISSOCK(path_stat.st_mode))
      return fs::file_status(fs::socket_file,
        static_cast<perms>(path_stat.st_mode) & fs::perms_mask);
    return fs::file_status(fs::type_unknown);

#   else  // Windows

    DWORD attr(::GetFileAttributesW(p.c_str()));
    if (attr == 0xFFFFFFFF)
    {
      return process_status_failure(p, ec);
    }

    //  reparse point handling;
    //    since GetFileAttributesW does not resolve symlinks, try to open a file
    //    handle to discover if the file exists
    if (attr & FILE_ATTRIBUTE_REPARSE_POINT)
    {
      handle_wrapper h(
        create_file_handle(
            p.c_str(),
            0,  // dwDesiredAccess; attributes only
            FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE,
            0,  // lpSecurityAttributes
            OPEN_EXISTING,
            FILE_FLAG_BACKUP_SEMANTICS,
            0)); // hTemplateFile
      if (h.handle == INVALID_HANDLE_VALUE)
      {
        return process_status_failure(p, ec);
      }

      if (!is_reparse_point_a_symlink(p))
        return file_status(reparse_file, make_permissions(p, attr));
    }

    if (ec != 0) ec->clear();
    return (attr & FILE_ATTRIBUTE_DIRECTORY)
      ? file_status(directory_file, make_permissions(p, attr))
      : file_status(regular_file, make_permissions(p, attr));

#   endif
  }